

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

bool __thiscall InterpreterThunkEmitter::NewThunkBlock(InterpreterThunkEmitter *this)

{
  bool bVar1;
  code *pcVar2;
  uint uVar3;
  BYTE *callTargetAddress;
  bool bVar4;
  undefined4 *puVar5;
  TEmitBufferAllocation *allocation;
  ThreadContext *pTVar6;
  Type *this_00;
  ThreadContextInfo *threadContext;
  void *local_58;
  void *pdataTable;
  PRUNTIME_FUNCTION pdataStart;
  intptr_t epilogEnd;
  BYTE *pBStack_38;
  DWORD count;
  BYTE *buffer;
  
  bVar1 = (this->scriptContext->config).NoDynamicThunks;
  if (bVar1 != false) {
LAB_005189c2:
    return (bool)(bVar1 ^ 1);
  }
  if (this->thunkCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x168,"(this->thunkCount == 0)","this->thunkCount == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  allocation = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
               ::AllocateBuffer(&this->emitBufferManager,0x1000,&stack0xffffffffffffffc8,0,0,false,
                                false);
  if (allocation != (TEmitBufferAllocation *)0x0) {
    bVar4 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
            ::ProtectBufferWithExecuteReadWriteForInterpreter(&this->emitBufferManager,allocation);
    if (bVar4) {
      pdataTable = (void *)0x0;
      pdataStart = (PRUNTIME_FUNCTION)0x0;
      epilogEnd._4_4_ = this->thunkCount;
      pTVar6 = this->scriptContext->threadContext;
      threadContext = &pTVar6->super_ThreadContextInfo;
      if (pTVar6 == (ThreadContext *)0x0) {
        threadContext = (ThreadContextInfo *)0x0;
      }
      FillBuffer(threadContext,this->isAsmInterpreterThunk,(intptr_t)pBStack_38,(size_t)pTVar6,
                 pBStack_38,(PRUNTIME_FUNCTION *)&pdataTable,(intptr_t *)&pdataStart,
                 (DWORD *)((long)&epilogEnd + 4));
      bVar4 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
              ::CommitBufferForInterpreter(&this->emitBufferManager,allocation,pBStack_38,0x1000);
      callTargetAddress = pBStack_38;
      if (bVar4) {
        pTVar6 = ThreadContext::GetContextForCurrentThread();
        ThreadContextInfo::SetValidCallTargetForCFG
                  (&pTVar6->super_ThreadContextInfo,callTargetAddress,true);
        uVar3 = epilogEnd._4_4_;
        this_00 = SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
                  PrependNode<unsigned_char*,unsigned_int>
                            ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)
                             &this->thunkBlocks,this->allocator,pBStack_38,epilogEnd._4_4_);
        PDataManager::RegisterPdata
                  ((RUNTIME_FUNCTION *)pdataTable,(ULONG_PTR)pBStack_38,(ULONG_PTR)pdataStart,
                   &local_58,1,1);
        ThunkBlock::SetPdata(this_00,local_58);
        this->thunkBuffer = pBStack_38;
        this->thunkCount = uVar3;
        goto LAB_005189c2;
      }
    }
  }
  Js::Throw::OutOfMemory();
}

Assistant:

bool InterpreterThunkEmitter::NewThunkBlock()
{
    if (this->scriptContext->GetConfig()->IsNoDynamicThunks())
    {
        return false;
    }

#ifdef ENABLE_OOP_NATIVE_CODEGEN
    if (CONFIG_FLAG(ForceStaticInterpreterThunk))
    {
        return false;
    }

    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        return NewOOPJITThunkBlock();
    }
#endif

    Assert(this->thunkCount == 0);
    BYTE* buffer;

    EmitBufferAllocation<VirtualAllocWrapper, PreReservedVirtualAllocWrapper> * allocation = emitBufferManager.AllocateBuffer(BlockSize, &buffer);
    if (allocation == nullptr)
    {
        Js::Throw::OutOfMemory();
    }
    if (!emitBufferManager.ProtectBufferWithExecuteReadWriteForInterpreter(allocation))
    {
        Js::Throw::OutOfMemory();
    }

#if PDATA_ENABLED
    PRUNTIME_FUNCTION pdataStart = nullptr;
    intptr_t epilogEnd = 0;
#endif

    DWORD count = this->thunkCount;
    FillBuffer(
        this->scriptContext->GetThreadContext(),
        this->isAsmInterpreterThunk,
        (intptr_t)buffer,
        BlockSize,
        buffer,
#if PDATA_ENABLED
        &pdataStart,
        &epilogEnd,
#endif
        &count
    );

    if (!emitBufferManager.CommitBufferForInterpreter(allocation, buffer, BlockSize))
    {
        Js::Throw::OutOfMemory();
    }

    // Call to set VALID flag for CFG check
    BYTE* callTarget = buffer;
#ifdef _M_ARM
    // We want to allow the actual callable value, so thumb-tag the address
    callTarget = (BYTE*)((uintptr_t)buffer | 0x1);
#endif
    ThreadContext::GetContextForCurrentThread()->SetValidCallTargetForCFG(callTarget);

    // Update object state only at the end when everything has succeeded - and no exceptions can be thrown.
    auto block = this->thunkBlocks.PrependNode(allocator, buffer, count);
#if PDATA_ENABLED
    void* pdataTable;
    PDataManager::RegisterPdata((PRUNTIME_FUNCTION)pdataStart, (ULONG_PTR)buffer, (ULONG_PTR)epilogEnd, &pdataTable);
    block->SetPdata(pdataTable);
#else
    Unused(block);
#endif
    this->thunkBuffer = buffer;
    this->thunkCount = count;
    return true;
}